

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_simd.cpp
# Opt level: O3

void multikey_simd_parallel<unsigned_short>(uchar **strings,size_t N,size_t depth)

{
  uchar *puVar1;
  uchar *puVar2;
  size_t N_00;
  unsigned_short pivot;
  ushort uVar3;
  int iVar4;
  size_t i;
  size_t sVar5;
  void *__src;
  uchar **ppuVar6;
  uint8_t *puVar7;
  uchar **ppuVar8;
  ulong n;
  byte bVar9;
  byte bVar10;
  long lVar11;
  uint8_t *puVar12;
  ulong uVar13;
  array<unsigned_long,_3UL> bucketsize;
  size_t bucketindex [3];
  char local_98;
  uint8_t *local_88;
  size_t sStack_80;
  size_t local_78;
  size_t local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  size_t local_50;
  long local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  if (N < 0x20) {
    if (1 < N) {
      ppuVar6 = strings;
      do {
        puVar1 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar8 = ppuVar6; strings < ppuVar8; ppuVar8 = ppuVar8 + -1) {
          puVar2 = ppuVar8[-1];
          bVar9 = puVar2[depth];
          bVar10 = puVar1[depth];
          if ((bVar9 != 0) && (lVar11 = depth + 1, bVar9 == bVar10)) {
            do {
              bVar9 = puVar2[lVar11];
              bVar10 = puVar1[lVar11];
              if (bVar9 == 0) break;
              lVar11 = lVar11 + 1;
            } while (bVar9 == bVar10);
          }
          if (bVar9 <= bVar10) break;
          *ppuVar8 = puVar2;
        }
        iVar4 = (int)N;
        *ppuVar8 = puVar1;
        N = (size_t)(iVar4 - 1);
      } while (2 < iVar4);
    }
  }
  else {
    pivot = pseudo_median<unsigned_short>(strings,N,depth);
    iVar4 = posix_memalign(&local_88,0x10,N);
    puVar12 = local_88;
    if (iVar4 != 0) {
      puVar12 = (uint8_t *)0x0;
    }
    local_88 = (uint8_t *)0x0;
    sStack_80 = 0;
    local_78 = 0;
    uVar13 = N & 0xffffffffffffffe0;
    puVar7 = puVar12;
    n = uVar13;
    ppuVar6 = strings;
    if (0x100000 < N) {
      n = uVar13 >> 1;
      calculate_bucketsizes_sse<false>(strings,n,puVar12,pivot,depth);
      puVar7 = puVar12 + n;
      ppuVar6 = (uchar **)((long)strings + uVar13 * 4);
    }
    calculate_bucketsizes_sse<false>(ppuVar6,n,puVar7,pivot,depth);
    if (uVar13 != N) {
      do {
        puVar1 = strings[uVar13];
        if (puVar1 == (uchar *)0x0) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                        ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
        }
        if (puVar1[depth] == '\0') {
          uVar3 = 0;
        }
        else {
          uVar3 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
        }
        puVar12[uVar13] = (pivot <= uVar3 && uVar3 != pivot) * '\x02' | uVar3 == pivot;
        uVar13 = uVar13 + 1;
      } while (uVar13 < N);
    }
    sVar5 = 0;
    do {
      (&local_88)[puVar12[sVar5]] = (&local_88)[puVar12[sVar5]] + 1;
      N_00 = local_78;
      puVar7 = local_88;
      sVar5 = sVar5 + 1;
    } while (N != sVar5);
    local_50 = sStack_80;
    local_58 = local_88 + sStack_80;
    if (local_58 + local_78 != (uint8_t *)N) {
      __assert_fail("bucketsize[0] + bucketsize[1] + bucketsize[2] == N",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_simd.cpp"
                    ,0x1c2,
                    "void multikey_simd_parallel(unsigned char **, size_t, size_t) [CharT = unsigned short]"
                   );
    }
    local_68 = N * 8;
    __src = malloc(local_68);
    local_48 = 0;
    local_60 = puVar7;
    local_40 = puVar7;
    local_38 = local_58;
    sVar5 = 0;
    do {
      puVar1 = strings[sVar5];
      lVar11 = (&local_48)[puVar12[sVar5]];
      (&local_48)[puVar12[sVar5]] = lVar11 + 1;
      *(uchar **)((long)__src + lVar11 * 8) = puVar1;
      sVar5 = sVar5 + 1;
    } while (N != sVar5);
    memcpy(strings,__src,local_68);
    free(__src);
    free(puVar12);
    puVar12 = local_60;
    multikey_simd_parallel<unsigned_short>(strings,(size_t)local_60,depth);
    sVar5 = local_50;
    local_98 = (char)pivot;
    if (local_98 != '\0') {
      multikey_simd_parallel<unsigned_short>(strings + (long)puVar12,local_50,depth + 2);
    }
    multikey_simd_parallel<unsigned_short>(strings + (long)(puVar12 + sVar5),N_00,depth);
  }
  return;
}

Assistant:

static void
multikey_simd_parallel(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 32) {
		insertion_sort(strings, N, depth);
		return;
	}
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	uint8_t* const restrict oracle =
		static_cast<uint8_t*>(_mm_malloc(N, 16));
	std::array<size_t, 3> bucketsize;
	bucketsize.fill(0);
	size_t i=N-N%32;
	if (N > 0x100000) {
#pragma omp parallel sections
		{
#pragma omp section
		calculate_bucketsizes_sse<false>(strings, i/2, oracle,
				partval, depth);
#pragma omp section
		calculate_bucketsizes_sse<false>(strings+i/2, i/2, oracle+i/2,
				partval, depth);
		}
	} else
		calculate_bucketsizes_sse<false>(strings, i, oracle, partval, depth);
	for (; i < N; ++i)
		oracle[i] = get_bucket(
				get_char<CharT>(strings[i], depth),
				partval);
	for (i=0; i < N; ++i)
		++bucketsize[oracle[i]];
	assert(bucketsize[0] + bucketsize[1] + bucketsize[2] == N);
	unsigned char** sorted =
		static_cast<unsigned char**>(malloc(N*sizeof(unsigned char*)));
	size_t bucketindex[3];
	bucketindex[0] = 0;
	bucketindex[1] = bucketsize[0];
	bucketindex[2] = bucketsize[0] + bucketsize[1];
	for (size_t i=0; i < N; ++i) {
		sorted[bucketindex[oracle[i]]++] = strings[i];
	}
	std::copy(sorted, sorted+N, strings);
	free(sorted);
	_mm_free(oracle);
#pragma omp parallel sections
	{
#pragma omp section
	multikey_simd_parallel<CharT>(strings, bucketsize[0], depth);
#pragma omp section
	if (not is_end(partval))
		multikey_simd_parallel<CharT>(strings+bucketsize[0],
				bucketsize[1], depth+sizeof(CharT));
#pragma omp section
	multikey_simd_parallel<CharT>(strings+bucketsize[0]+bucketsize[1],
			bucketsize[2], depth);
	}
}